

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O1

int SSL_ECH_KEYS_has_duplicate_config_id(SSL_ECH_KEYS *keys)

{
  byte bVar1;
  size_t sVar2;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  bool seen [256];
  char acStack_108 [256];
  
  memset(acStack_108,0,0x100);
  sVar2 = (keys->configs).size_;
  bVar6 = sVar2 != 0;
  if (bVar6) {
    puVar3 = (keys->configs).data_;
    bVar1 = *(uint8_t *)
             ((long)&((puVar3->_M_t).
                      super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl)->
                     ech_config_ + 0x43);
    if (acStack_108[bVar1] == '\0') {
      pcVar5 = acStack_108 + bVar1;
      lVar4 = 8;
      do {
        *pcVar5 = '\x01';
        bVar7 = sVar2 << 3 == lVar4;
        bVar6 = !bVar7;
        if (bVar7) break;
        pcVar5 = acStack_108 +
                 *(byte *)(*(long *)((long)&(puVar3->_M_t).
                                            super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>.
                                            _M_head_impl + lVar4) + 0x43);
        lVar4 = lVar4 + 8;
      } while (*pcVar5 == '\0');
    }
  }
  return (int)bVar6;
}

Assistant:

int SSL_ECH_KEYS_has_duplicate_config_id(const SSL_ECH_KEYS *keys) {
  bool seen[256] = {false};
  for (const auto &config : keys->configs) {
    if (seen[config->ech_config().config_id]) {
      return 1;
    }
    seen[config->ech_config().config_id] = true;
  }
  return 0;
}